

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::scrollContentsBy(QTextEdit *this,int dx,int dy)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  int dx_00;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar3 = QWidget::isRightToLeft((QWidget *)this);
  dx_00 = -dx;
  if (!bVar3) {
    dx_00 = dx;
  }
  QWidget::scroll(*(QWidget **)(lVar1 + 0x2b0),dx_00,dy);
  uVar2 = QGuiApplication::inputMethod();
  QInputMethod::update(uVar2,0x4002);
  return;
}

Assistant:

void QTextEdit::scrollContentsBy(int dx, int dy)
{
    Q_D(QTextEdit);
    if (isRightToLeft())
        dx = -dx;
    d->viewport->scroll(dx, dy);
    QGuiApplication::inputMethod()->update(Qt::ImCursorRectangle | Qt::ImAnchorRectangle);
}